

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_c.cpp
# Opt level: O0

complex<float> cdotu(int n,complex<float> *cx,int incx,complex<float> *cy,int incy)

{
  _ComplexT_conflict extraout_XMM0_Qa;
  _ComplexT_conflict extraout_XMM0_Qa_00;
  complex<float> local_68 [2];
  complex<float> local_58 [2];
  complex<float> local_48;
  int local_40;
  int local_3c;
  int iy;
  int ix;
  int i;
  int incy_local;
  complex<float> *cy_local;
  complex<float> *pcStack_20;
  int incx_local;
  complex<float> *cx_local;
  complex<float> cStack_10;
  int n_local;
  complex<float> value;
  
  ix = incy;
  _i = cy;
  cy_local._4_4_ = incx;
  pcStack_20 = cx;
  cx_local._4_4_ = n;
  std::complex<float>::complex(&stack0xfffffffffffffff0,0.0,0.0);
  std::complex<float>::complex(&local_48,0.0,0.0);
  cStack_10._M_value = local_48._M_value;
  if (0 < cx_local._4_4_) {
    if ((cy_local._4_4_ == 1) && (ix == 1)) {
      for (iy = 0; iy < cx_local._4_4_; iy = iy + 1) {
        std::operator*(pcStack_20 + iy,_i + iy);
        std::operator+(&stack0xfffffffffffffff0,local_58);
        cStack_10._M_value = extraout_XMM0_Qa;
      }
    }
    else {
      if (cy_local._4_4_ < 0) {
        local_3c = (1 - cx_local._4_4_) * cy_local._4_4_;
      }
      else {
        local_3c = 0;
      }
      if (ix < 0) {
        local_40 = (1 - cx_local._4_4_) * ix;
      }
      else {
        local_40 = 0;
      }
      for (iy = 0; iy < cx_local._4_4_; iy = iy + 1) {
        std::operator*(pcStack_20 + local_3c,_i + local_40);
        std::operator+(&stack0xfffffffffffffff0,local_68);
        local_3c = local_3c + cy_local._4_4_;
        local_40 = local_40 + ix;
        cStack_10._M_value = extraout_XMM0_Qa_00;
      }
    }
    local_48._M_value = (_ComplexT_conflict)(uint)iy;
  }
  return (complex<float>)local_48._M_value;
}

Assistant:

complex <float> cdotu ( int n, complex <float> cx[], int incx,
  complex <float> cy[], int incy )

//****************************************************************************80
//
//  Purpose:
//
//    CDOTU forms the unconjugated dot product of two vectors.
//
//  Discussion:
//
//    This routine uses single precision complex arithmetic.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    10 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vectors.
//
//    Input, complex <float> CX[], the first vector.
//
//    Input, int INCX, the increment between successive entries in CX.
//
//    Input, complex <float> CY[], the second vector.
//
//    Input, int INCY, the increment between successive entries in CY.
//
//    Output, complex <float> CDOTU, the unconjugated dot product of
//    the corresponding entries of CX and CY.
//
{
  int i;
  int ix;
  int iy;
  complex <float> value;

  value = complex <float> ( 0.0, 0.0 );

  if ( n <= 0 )
  {
    return value;
  }

  if ( incx == 1 && incy == 1 )
  {
    for ( i = 0; i < n; i++ )
    {
      value = value + cx[i] * cy[i];
    }
  }
  else
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( -n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( -n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      value = value + cx[ix] * cy[iy];
      ix = ix + incx;
      iy = iy + incy;
    }
  }
  return value;
}